

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoveIntegration.h
# Opt level: O0

void __thiscall libchess::Position::make_move(Position *this,Move move)

{
  uint uVar1;
  Type TVar2;
  __optional_eq_t<libchess::PieceType,_libchess::PieceType> _Var3;
  bool bVar4;
  value_type vVar5;
  value_type vVar6;
  uint uVar7;
  _Optional_payload_base<libchess::PieceType> _Var8;
  Square *__u;
  PieceType *pPVar9;
  hash_type hVar10;
  Position *in_RDI;
  Type move_type;
  optional<libchess::PieceType> promotion_pt;
  optional<libchess::PieceType> captured_pt;
  optional<libchess::PieceType> moving_pt;
  Square to_square;
  Square from_square;
  State *next_state;
  State *prev_state;
  Color stm;
  undefined4 in_stack_fffffffffffffe48;
  int in_stack_fffffffffffffe4c;
  value_type in_stack_fffffffffffffe50;
  value_type in_stack_fffffffffffffe54;
  Move *in_stack_fffffffffffffe58;
  vector<libchess::Position::State,_std::allocator<libchess::Position::State>_> *this_00;
  Color in_stack_fffffffffffffe7c;
  PieceType in_stack_fffffffffffffe80;
  Square in_stack_fffffffffffffe84;
  Square square;
  undefined4 in_stack_fffffffffffffe88;
  Color in_stack_fffffffffffffe8c;
  PieceType in_stack_fffffffffffffe90;
  Color in_stack_fffffffffffffe94;
  Color in_stack_fffffffffffffe98;
  PieceType in_stack_fffffffffffffe9c;
  Square in_stack_fffffffffffffea0;
  Square in_stack_fffffffffffffea4;
  undefined4 in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffec4;
  CastlingRights local_74;
  MetaValueType<int> local_70;
  PieceType local_6c;
  _Optional_payload_base<libchess::Square> local_68;
  State *local_60;
  State *local_58;
  undefined1 local_34;
  undefined8 local_30;
  undefined8 local_28;
  undefined4 local_20;
  Color local_14;
  
  local_14 = side_to_move(in_RDI);
  vVar5 = MetaValueType::operator_cast_to_int((MetaValueType *)&local_14);
  vVar6 = MetaValueType::operator_cast_to_int((MetaValueType *)&constants::BLACK);
  if (vVar5 == vVar6) {
    in_RDI->fullmoves_ = in_RDI->fullmoves_ + 1;
  }
  in_RDI->ply_ = in_RDI->ply_ + 1;
  this_00 = &in_RDI->history_;
  CastlingRights::CastlingRights((CastlingRights *)0x1219c8);
  std::optional<libchess::Square>::optional((optional<libchess::Square> *)0x1219d9);
  std::optional<libchess::Move>::optional((optional<libchess::Move> *)0x1219ea);
  std::optional<libchess::PieceType>::optional((optional<libchess::PieceType> *)0x1219fb);
  local_34 = 0;
  local_30 = 0;
  local_28 = 0;
  local_20 = 0;
  std::vector<libchess::Position::State,_std::allocator<libchess::Position::State>_>::push_back
            ((vector<libchess::Position::State,_std::allocator<libchess::Position::State>_> *)
             CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
             (value_type *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
  local_58 = state_mut_ref((Position *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50)
                           ,in_stack_fffffffffffffe4c);
  local_60 = state_mut_ref((Position *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50)
                          );
  local_60->halfmoves_ = local_58->halfmoves_ + 1;
  std::optional<libchess::Move>::operator=
            ((optional<libchess::Move> *)this_00,in_stack_fffffffffffffe58);
  std::optional<libchess::Square>::optional((optional<libchess::Square> *)0x121aa1);
  (local_60->enpassant_square_).super__Optional_base<libchess::Square,_true,_true>._M_payload.
  super__Optional_payload_base<libchess::Square> = local_68;
  local_6c.super_MetaValueType<int>.value_ =
       (MetaValueType<int>)
       Move::from_square((Move *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
  local_70.value_ =
       (value_type)
       Move::to_square((Move *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
  uVar7 = CastlingRights::value(&local_58->castling_rights_);
  vVar5 = MetaValueType<int>::value(&local_6c.super_MetaValueType<int>);
  uVar1 = castling_spoilers[vVar5];
  vVar5 = MetaValueType<int>::value(&local_70);
  CastlingRights::CastlingRights(&local_74,uVar7 & uVar1 & castling_spoilers[vVar5]);
  (local_60->castling_rights_).value_ = local_74.value_;
  piece_type_on((Position *)
                CONCAT44(in_stack_fffffffffffffe94.super_MetaValueType<int>.value_,
                         in_stack_fffffffffffffe90.super_MetaValueType<int>.value_),
                (Square)in_stack_fffffffffffffe9c.super_MetaValueType<int>.value_);
  _Var8 = (_Optional_payload_base<libchess::PieceType>)
          piece_type_on((Position *)
                        CONCAT44(in_stack_fffffffffffffe94.super_MetaValueType<int>.value_,
                                 in_stack_fffffffffffffe90.super_MetaValueType<int>.value_),
                        (Square)in_stack_fffffffffffffe9c.super_MetaValueType<int>.value_);
  Move::promotion_piece_type(in_stack_fffffffffffffe58);
  TVar2 = move_type_of((Position *)
                       CONCAT44(in_stack_fffffffffffffe8c.super_MetaValueType<int>.value_,
                                in_stack_fffffffffffffe88),
                       (Move)in_stack_fffffffffffffe90.super_MetaValueType<int>.value_);
  _Var3 = std::operator==((optional<libchess::PieceType> *)
                          CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                          (PieceType *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48)
                         );
  if ((_Var3) ||
     (bVar4 = std::optional::operator_cast_to_bool((optional<libchess::PieceType> *)0x121bfc), bVar4
     )) {
    local_60->halfmoves_ = 0;
  }
  __u = (Square *)(ulong)TVar2;
  switch(__u) {
  case (Square *)0x0:
    break;
  case (Square *)0x1:
    std::optional<libchess::PieceType>::operator*((optional<libchess::PieceType> *)0x121c66);
    move_piece((Position *)
               CONCAT44(in_stack_fffffffffffffe94.super_MetaValueType<int>.value_,
                        in_stack_fffffffffffffe90.super_MetaValueType<int>.value_),
               in_stack_fffffffffffffea4,in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c,
               in_stack_fffffffffffffe98);
    break;
  case (Square *)0x2:
    move_piece((Position *)
               CONCAT44(in_stack_fffffffffffffe94.super_MetaValueType<int>.value_,
                        in_stack_fffffffffffffe90.super_MetaValueType<int>.value_),
               in_stack_fffffffffffffea4,in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c,
               in_stack_fffffffffffffe98);
    vVar5 = MetaValueType::operator_cast_to_int((MetaValueType *)&local_70);
    if (vVar5 == 2) {
      move_piece((Position *)
                 CONCAT44(in_stack_fffffffffffffe94.super_MetaValueType<int>.value_,
                          in_stack_fffffffffffffe90.super_MetaValueType<int>.value_),
                 in_stack_fffffffffffffea4,in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c,
                 in_stack_fffffffffffffe98);
    }
    else if (vVar5 == 6) {
      move_piece((Position *)
                 CONCAT44(in_stack_fffffffffffffe94.super_MetaValueType<int>.value_,
                          in_stack_fffffffffffffe90.super_MetaValueType<int>.value_),
                 in_stack_fffffffffffffea4,in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c,
                 in_stack_fffffffffffffe98);
    }
    else if (vVar5 == 0x3a) {
      move_piece((Position *)
                 CONCAT44(in_stack_fffffffffffffe94.super_MetaValueType<int>.value_,
                          in_stack_fffffffffffffe90.super_MetaValueType<int>.value_),
                 in_stack_fffffffffffffea4,in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c,
                 in_stack_fffffffffffffe98);
    }
    else if (vVar5 == 0x3e) {
      in_stack_fffffffffffffec4 = 0x3f;
      in_stack_fffffffffffffec0 = 0x3d;
      move_piece((Position *)
                 CONCAT44(in_stack_fffffffffffffe94.super_MetaValueType<int>.value_,
                          in_stack_fffffffffffffe90.super_MetaValueType<int>.value_),
                 in_stack_fffffffffffffea4,in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c,
                 in_stack_fffffffffffffe98);
    }
    break;
  case (Square *)0x3:
    move_piece((Position *)
               CONCAT44(in_stack_fffffffffffffe94.super_MetaValueType<int>.value_,
                        in_stack_fffffffffffffe90.super_MetaValueType<int>.value_),
               in_stack_fffffffffffffea4,in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c,
               in_stack_fffffffffffffe98);
    in_stack_fffffffffffffe50 = MetaValueType::operator_cast_to_int((MetaValueType *)&local_14);
    vVar5 = MetaValueType::operator_cast_to_int((MetaValueType *)&constants::WHITE);
    if (in_stack_fffffffffffffe50 == vVar5) {
      Square::operator-((Square *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48),0);
    }
    else {
      Square::operator+((Square *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48),0);
    }
    Color::operator!((Color *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
    remove_piece((Position *)
                 CONCAT44(in_stack_fffffffffffffe84.super_MetaValueType<int>.value_,
                          in_stack_fffffffffffffe80.super_MetaValueType<int>.value_),
                 (Square)in_stack_fffffffffffffe94.super_MetaValueType<int>.value_,
                 in_stack_fffffffffffffe90,in_stack_fffffffffffffe8c);
    break;
  case (Square *)0x4:
    remove_piece((Position *)
                 CONCAT44(in_stack_fffffffffffffe84.super_MetaValueType<int>.value_,
                          in_stack_fffffffffffffe80.super_MetaValueType<int>.value_),
                 (Square)in_stack_fffffffffffffe94.super_MetaValueType<int>.value_,
                 in_stack_fffffffffffffe90,in_stack_fffffffffffffe8c);
    std::optional<libchess::PieceType>::operator*((optional<libchess::PieceType> *)0x1221a2);
    put_piece(in_RDI,in_stack_fffffffffffffe84,in_stack_fffffffffffffe80,in_stack_fffffffffffffe7c);
    break;
  case (Square *)0x5:
    move_piece((Position *)
               CONCAT44(in_stack_fffffffffffffe94.super_MetaValueType<int>.value_,
                        in_stack_fffffffffffffe90.super_MetaValueType<int>.value_),
               in_stack_fffffffffffffea4,in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c,
               in_stack_fffffffffffffe98);
    in_stack_fffffffffffffe54 = MetaValueType::operator_cast_to_int((MetaValueType *)&local_14);
    vVar5 = MetaValueType::operator_cast_to_int((MetaValueType *)&constants::WHITE);
    if (in_stack_fffffffffffffe54 == vVar5) {
      Square::operator+((Square *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48),0);
    }
    else {
      Square::operator-((Square *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48),0);
    }
    std::optional<libchess::Square>::operator=((optional<libchess::Square> *)this_00,__u);
    break;
  case (Square *)0x6:
    std::optional<libchess::PieceType>::operator*((optional<libchess::PieceType> *)0x121cc4);
    Color::operator!((Color *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
    remove_piece((Position *)
                 CONCAT44(in_stack_fffffffffffffe84.super_MetaValueType<int>.value_,
                          in_stack_fffffffffffffe80.super_MetaValueType<int>.value_),
                 (Square)in_stack_fffffffffffffe94.super_MetaValueType<int>.value_,
                 in_stack_fffffffffffffe90,in_stack_fffffffffffffe8c);
    std::optional<libchess::PieceType>::operator*((optional<libchess::PieceType> *)0x121d29);
    move_piece((Position *)
               CONCAT44(in_stack_fffffffffffffe94.super_MetaValueType<int>.value_,
                        in_stack_fffffffffffffe90.super_MetaValueType<int>.value_),
               in_stack_fffffffffffffea4,in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c,
               in_stack_fffffffffffffe98);
    break;
  case (Square *)0x7:
    std::optional<libchess::PieceType>::operator*((optional<libchess::PieceType> *)0x1221e6);
    in_stack_fffffffffffffe94 =
         Color::operator!((Color *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
    remove_piece((Position *)
                 CONCAT44(in_stack_fffffffffffffe84.super_MetaValueType<int>.value_,
                          in_stack_fffffffffffffe80.super_MetaValueType<int>.value_),
                 (Square)in_stack_fffffffffffffe94.super_MetaValueType<int>.value_,
                 in_stack_fffffffffffffe90,in_stack_fffffffffffffe8c);
    in_stack_fffffffffffffe90.super_MetaValueType<int>.value_ =
         local_6c.super_MetaValueType<int>.value_;
    remove_piece((Position *)
                 CONCAT44(in_stack_fffffffffffffe84.super_MetaValueType<int>.value_,
                          in_stack_fffffffffffffe80.super_MetaValueType<int>.value_),
                 (Square)in_stack_fffffffffffffe94.super_MetaValueType<int>.value_,local_6c,
                 (Color)0x0);
    square.super_MetaValueType<int>.value_ = (MetaValueType<int>)(MetaValueType<int>)local_70.value_
    ;
    pPVar9 = std::optional<libchess::PieceType>::operator*
                       ((optional<libchess::PieceType> *)0x122261);
    put_piece(in_RDI,square,(PieceType)(pPVar9->super_MetaValueType<int>).value_,local_14);
  }
  (local_60->captured_pt_).super__Optional_base<libchess::PieceType,_true,_true>._M_payload.
  super__Optional_payload_base<libchess::PieceType> = _Var8;
  local_60->move_type_ = TVar2;
  reverse_side_to_move((Position *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50));
  hVar10 = calculate_hash((Position *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0))
  ;
  local_60->hash_ = hVar10;
  hVar10 = calculate_pawn_hash((Position *)
                               CONCAT44(in_stack_fffffffffffffe94.super_MetaValueType<int>.value_,
                                        in_stack_fffffffffffffe90.super_MetaValueType<int>.value_));
  local_60->pawn_hash_ = hVar10;
  return;
}

Assistant:

inline void Position::make_move(Move move) {
    Color stm = side_to_move();
    if (stm == constants::BLACK) {
        ++fullmoves_;
    }
    ++ply_;
    history_.push_back(State{});
    State& prev_state = state_mut_ref(ply_ - 1);
    State& next_state = state_mut_ref();
    next_state.halfmoves_ = prev_state.halfmoves_ + 1;
    next_state.previous_move_ = move;
    next_state.enpassant_square_ = {};

    Square from_square = move.from_square();
    Square to_square = move.to_square();

    next_state.castling_rights_ = CastlingRights{prev_state.castling_rights_.value() &
                                                 castling_spoilers[from_square.value()] &
                                                 castling_spoilers[to_square.value()]};

    auto moving_pt = piece_type_on(from_square);
    auto captured_pt = piece_type_on(to_square);
    auto promotion_pt = move.promotion_piece_type();

    Move::Type move_type = move_type_of(move);

    if (moving_pt == constants::PAWN || captured_pt) {
        next_state.halfmoves_ = 0;
    }

    switch (move_type) {
    case Move::Type::NORMAL:
        move_piece(from_square, to_square, *moving_pt, stm);
        break;
    case Move::Type::CAPTURE:
        remove_piece(to_square, *captured_pt, !stm);
        move_piece(from_square, to_square, *moving_pt, stm);
        break;
    case Move::Type::DOUBLE_PUSH:
        move_piece(from_square, to_square, constants::PAWN, stm);
        next_state.enpassant_square_ =
            stm == constants::WHITE ? Square(from_square + 8) : Square(from_square - 8);
        break;
    case Move::Type::ENPASSANT:
        move_piece(from_square, to_square, constants::PAWN, stm);
        remove_piece(stm == constants::WHITE ? Square(to_square - 8) : Square(to_square + 8),
                     constants::PAWN, !stm);
        break;
    case Move::Type::CASTLING:
        move_piece(from_square, to_square, constants::KING, stm);
        switch (to_square) {
        case constants::C1:
            move_piece(constants::A1, constants::D1, constants::ROOK, stm);
            break;
        case constants::G1:
            move_piece(constants::H1, constants::F1, constants::ROOK, stm);
            break;
        case constants::C8:
            move_piece(constants::A8, constants::D8, constants::ROOK, stm);
            break;
        case constants::G8:
            move_piece(constants::H8, constants::F8, constants::ROOK, stm);
            break;
        default:
            break;
        }
        break;
    case Move::Type::PROMOTION:
        remove_piece(from_square, constants::PAWN, stm);
        put_piece(to_square, *promotion_pt, stm);
        break;
    case Move::Type::CAPTURE_PROMOTION:
        remove_piece(to_square, *captured_pt, !stm);
        remove_piece(from_square, constants::PAWN, stm);
        put_piece(to_square, *promotion_pt, stm);
        break;
    case Move::Type::NONE:
        break;
    }
    next_state.captured_pt_ = captured_pt;
    next_state.move_type_ = move_type;
    reverse_side_to_move();
    next_state.hash_ = calculate_hash();
    next_state.pawn_hash_ = calculate_pawn_hash();
}